

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanTest<char,signed_char>(void)

{
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_24;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_23;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_22;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_21;
  int local_20 [4];
  
  local_20[3] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_21,local_20 + 3);
  if ('\x02' < local_21.m_int) {
    local_20[2] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_22,local_20 + 2);
    if (local_22.m_int < '\x05') {
      local_20[1] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_23,local_20 + 1);
      local_20[0] = 7;
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_24,local_20);
      return local_23.m_int < local_24.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}